

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall Assimp::HMPImporter::GenerateTextureCoords(HMPImporter *this,uint width,uint height)

{
  bool bVar1;
  uint local_30;
  uint local_2c;
  uint x;
  uint y;
  float fX;
  float fY;
  aiVector3D *uv;
  uint height_local;
  uint width_local;
  HMPImporter *this_local;
  
  bVar1 = false;
  if ((((this->super_MDLImporter).pScene)->mMeshes != (aiMesh **)0x0) &&
     (bVar1 = false, *((this->super_MDLImporter).pScene)->mMeshes != (aiMesh *)0x0)) {
    bVar1 = (*((this->super_MDLImporter).pScene)->mMeshes)->mTextureCoords[0] != (aiVector3D *)0x0;
  }
  if (!bVar1) {
    __assert_fail("__null != pScene->mMeshes && __null != pScene->mMeshes[0] && __null != pScene->mMeshes[0]->mTextureCoords[0]"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/HMP/HMPLoader.cpp"
                  ,0x1fa,
                  "void Assimp::HMPImporter::GenerateTextureCoords(const unsigned int, const unsigned int)"
                 );
  }
  _fX = (*((this->super_MDLImporter).pScene)->mMeshes)->mTextureCoords[0];
  for (local_2c = 0; local_2c < height; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < width; local_30 = local_30 + 1) {
      _fX->y = (1.0 / (float)height + (1.0 / (float)height) / (float)(height - 1)) * (float)local_2c
      ;
      _fX->x = (1.0 / (float)width + (1.0 / (float)width) / (float)(width - 1)) * (float)local_30;
      _fX->z = 0.0;
      _fX = _fX + 1;
    }
  }
  return;
}

Assistant:

void HMPImporter::GenerateTextureCoords(
    const unsigned int width, const unsigned int height)
{
    ai_assert(NULL != pScene->mMeshes && NULL != pScene->mMeshes[0] &&
              NULL != pScene->mMeshes[0]->mTextureCoords[0]);

    aiVector3D* uv = pScene->mMeshes[0]->mTextureCoords[0];

    const float fY = (1.0f / height) + (1.0f / height) / (height-1);
    const float fX = (1.0f / width) + (1.0f / width) / (width-1);

    for (unsigned int y = 0; y < height;++y)    {
        for (unsigned int x = 0; x < width;++x,++uv)    {
            uv->y = fY*y;
            uv->x = fX*x;
            uv->z = 0.0f;
        }
    }
}